

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O2

int nn_xrespondent_recv(nn_sockbase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  size_t size;
  uint uVar1;
  uint32_t uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  uint8_t *buf;
  nn_pipe *pipe;
  nn_chunkref ref;
  
  uVar1 = nn_fq_recv((nn_fq *)&self[2].sock,msg,&pipe);
  if (-1 < (int)uVar1) {
    if ((uVar1 & 2) == 0) {
      self_00 = &msg->body;
      pvVar3 = nn_chunkref_data(self_00);
      sVar4 = nn_chunkref_size(self_00);
      sVar5 = 0;
      do {
        size = sVar5 + 4;
        if (sVar4 < size) {
          nn_msg_term(msg);
          return -0xb;
        }
        uVar2 = nn_getl((uint8_t *)(sVar5 + (long)pvVar3));
        sVar5 = size;
      } while (-1 < (int)uVar2);
      sVar5 = nn_chunkref_size(&msg->sphdr);
      if (sVar5 != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/xrespondent.c"
                ,0xe7);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_chunkref_term(&msg->sphdr);
      nn_chunkref_init(&msg->sphdr,size);
      pvVar6 = nn_chunkref_data(&msg->sphdr);
      memcpy(pvVar6,pvVar3,size);
      nn_chunkref_trim(self_00,size);
    }
    pvVar3 = nn_pipe_getdata(pipe);
    sVar5 = nn_chunkref_size(&msg->sphdr);
    nn_chunkref_init(&ref,sVar5 + 4);
    buf = (uint8_t *)nn_chunkref_data(&ref);
    nn_putl(buf,*(uint32_t *)((long)pvVar3 + 8));
    pvVar3 = nn_chunkref_data(&ref);
    pvVar6 = nn_chunkref_data(&msg->sphdr);
    sVar5 = nn_chunkref_size(&msg->sphdr);
    memcpy((void *)((long)pvVar3 + 4),pvVar6,sVar5);
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,&ref);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int nn_xrespondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrespondent *xrespondent;
    struct nn_pipe *pipe;
    int i;
    size_t sz;
    void *data;
    struct nn_chunkref ref;
    struct nn_xrespondent_data *pipedata;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    rc = nn_fq_recv (&xrespondent->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header (including survey ID) from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;

        while (1) {
	    /*  Ignore the malformed surveys without the bottom of the stack. */
	    if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;
    
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref, nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t *) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}